

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.c
# Opt level: O0

dePoolArray * dePoolArray_create(deMemPool *pool,int elementSize)

{
  dePoolArray *arr;
  int elementSize_local;
  deMemPool *pool_local;
  
  pool_local = (deMemPool *)deMemPool_alloc(pool,0x20);
  if (pool_local == (deMemPool *)0x0) {
    pool_local = (deMemPool *)0x0;
  }
  else {
    memset(pool_local,0,0x20);
    *(deMemPool **)pool_local = pool;
    *(int *)&pool_local->parent = elementSize;
  }
  return (dePoolArray *)pool_local;
}

Assistant:

dePoolArray* dePoolArray_create (deMemPool* pool, int elementSize)
{
	/* Alloc struct. */
	dePoolArray* arr = DE_POOL_NEW(pool, dePoolArray);
	if (!arr)
		return DE_NULL;

	/* Init array. */
	memset(arr, 0, sizeof(dePoolArray));
	arr->pool			= pool;
	arr->elementSize	= elementSize;

	return arr;
}